

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

AssertionResult * __thiscall
Catch::ExpressionResultBuilder::buildResult
          (AssertionResult *__return_storage_ptr__,ExpressionResultBuilder *this,AssertionInfo *info
          )

{
  bool bVar1;
  OfType OVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string sStack_a8;
  AssertionResultData data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = &sStack_a8;
  if ((this->m_data).resultType == Unknown) {
    __assert_fail("m_data.resultType != ResultWas::Unknown",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/catch/catch.hpp"
                  ,0x1453,
                  "AssertionResult Catch::ExpressionResultBuilder::buildResult(const AssertionInfo &) const"
                 );
  }
  AssertionResultData::AssertionResultData(&data,&this->m_data);
  bVar1 = (this->m_exprComponents).shouldNegate;
  if ((bVar1 & data.resultType == Ok) == 0) {
    OVar2 = Ok;
    if ((bVar1 & data.resultType == ExpressionFailed) != 1) goto LAB_0012aaa9;
  }
  else {
    OVar2 = ExpressionFailed;
  }
  data.resultType = OVar2;
LAB_0012aaa9:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&data.message,(string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  reconstructExpression_abi_cxx11_(&sStack_a8,this,info);
  std::__cxx11::string::operator=((string *)&data,(string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  if ((this->m_exprComponents).shouldNegate == true) {
    bVar1 = std::operator==(&(this->m_exprComponents).op,"");
    if (bVar1) {
      std::operator+(&sStack_a8,"!",&data.reconstructedExpression);
      std::__cxx11::string::operator=((string *)&data,(string *)&sStack_a8);
    }
    else {
      std::operator+(&local_40,"!(",&data.reconstructedExpression);
      std::operator+(&sStack_a8,&local_40,")");
      std::__cxx11::string::operator=((string *)&data,(string *)&sStack_a8);
      std::__cxx11::string::~string((string *)&sStack_a8);
      this_00 = &local_40;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  AssertionResult::AssertionResult(__return_storage_ptr__,info,&data);
  AssertionResultData::~AssertionResultData(&data);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult ExpressionResultBuilder::buildResult( const AssertionInfo& info ) const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if shouldNegate is set
        if( m_exprComponents.shouldNegate && data.resultType == ResultWas::Ok )
            data.resultType = ResultWas::ExpressionFailed;
        else if( m_exprComponents.shouldNegate && data.resultType == ResultWas::ExpressionFailed )
            data.resultType = ResultWas::Ok;

        data.message = m_stream.str();
        data.reconstructedExpression = reconstructExpression( info );
        if( m_exprComponents.shouldNegate ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( info, data );
    }